

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

pointer __thiscall QList<_drmModeModeInfo>::data(QList<_drmModeModeInfo> *this)

{
  detach(this);
  return (this->d).ptr;
}

Assistant:

pointer data() { detach(); return d->data(); }